

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

CharString * __thiscall CFFFileInput::GetGlobalSubr(CFFFileInput *this,long inSubrIndex)

{
  ushort uVar1;
  CharString *pCVar2;
  uint uVar3;
  unsigned_short biasedIndex;
  ushort local_a;
  
  uVar1 = (this->mGlobalSubrs).mCharStringsCount;
  uVar3 = (uint)inSubrIndex;
  if (uVar1 < 0x4d8) {
    uVar3 = uVar3 + 0x6b;
  }
  else if (uVar1 < 0x846c) {
    uVar3 = uVar3 + 0x46b;
  }
  else {
    uVar3 = uVar3 ^ 0x8000;
  }
  local_a = (ushort)uVar3;
  if (local_a < uVar1) {
    pCVar2 = (CharString *)
             ((long)&((this->mGlobalSubrs).mCharStringsIndex)->mStartPosition +
             (ulong)((uVar3 & 0xffff) * 0x18));
    if (this->mCurrentDependencies != (CharString2Dependencies *)0x0) {
      std::
      _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
      ::_M_insert_unique<unsigned_short_const&>
                ((_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                  *)&this->mCurrentDependencies->mGlobalSubrs,&local_a);
    }
  }
  else {
    pCVar2 = (CharString *)0x0;
  }
  return pCVar2;
}

Assistant:

CharString* CFFFileInput::GetGlobalSubr(long inSubrIndex)
{
	unsigned short biasedIndex = GetBiasedIndex(mGlobalSubrs.mCharStringsCount,inSubrIndex);	

	if(biasedIndex < mGlobalSubrs.mCharStringsCount)
	{
		CharString* returnValue = mGlobalSubrs.mCharStringsIndex + biasedIndex;
		if(mCurrentDependencies)
			mCurrentDependencies->mGlobalSubrs.insert(biasedIndex);
		return returnValue;
	}
	else
		return NULL;
}